

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::debug_line_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*>
          (rule *this,transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args)

{
  iterator *piVar1;
  not_null<context_*> ctxt;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  debug_line_index *this_00;
  ulong uVar5;
  __single_object p;
  _Head_base<0UL,_pstore::exchange::import_ns::debug_line_index_*,_false> local_38;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_30;
  
  this_00 = (debug_line_index *)operator_new(0x40);
  ctxt.ptr_ = (this->context_).ptr_;
  local_30._M_head_impl = (rule *)args;
  gsl::not_null<pstore::transaction_base_*>::ensure_invariant
            ((not_null<pstore::transaction_base_*> *)&local_30);
  debug_line_index::debug_line_index
            (this_00,ctxt,(not_null<transaction_base_*>)local_30._M_head_impl);
  local_38._M_head_impl = this_00;
  log_top(this,false);
  pcVar2 = (this->context_).ptr_;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&(pcVar2->stack).c);
  local_30._M_head_impl = &(local_38._M_head_impl)->super_rule;
  local_38._M_head_impl = (debug_line_index *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_30);
    if ((debug_line_index *)local_30._M_head_impl != (debug_line_index *)0x0) {
      (*((rule *)&(local_30._M_head_impl)->_vptr_rule)->_vptr_rule[1])();
    }
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_30._M_head_impl;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  log_top(this,true);
  uVar5 = std::_V2::system_category();
  std::
  unique_ptr<pstore::exchange::import_ns::debug_line_index,_std::default_delete<pstore::exchange::import_ns::debug_line_index>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::debug_line_index,_std::default_delete<pstore::exchange::import_ns::debug_line_index>_>
                 *)&local_38);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar5;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }